

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

shared_ptr<kratos::IfStmt> __thiscall
kratos::RemoveEmptyBlockVisitor::process
          (RemoveEmptyBlockVisitor *this,shared_ptr<kratos::IfStmt> *stmt)

{
  IfStmt *pIVar1;
  long lVar2;
  Expr *pEVar3;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::IfStmt> sVar4;
  undefined1 local_a0 [8];
  shared_ptr<kratos::ScopedStmtBlock> then_;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<kratos::StmtBlock,(__gnu_cxx::_Lock_policy)2> local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  _func_int **local_70;
  shared_ptr<kratos::StmtBlock> then_body;
  shared_ptr<kratos::StmtBlock> else_body;
  shared_ptr<kratos::Var> cond;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)local_a0,
             (__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)(*in_RDX + 0xe0));
  std::__shared_ptr<kratos::StmtBlock,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::ScopedStmtBlock,void>
            ((__shared_ptr<kratos::StmtBlock,(__gnu_cxx::_Lock_policy)2> *)
             &then_.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             (__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)local_a0);
  process((RemoveEmptyBlockVisitor *)&local_70,(shared_ptr<kratos::StmtBlock> *)stmt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__shared_ptr<kratos::StmtBlock,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::ScopedStmtBlock,void>
            (local_80,(__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
                      (*in_RDX + 0xf0));
  process((RemoveEmptyBlockVisitor *)
          &then_body.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
          (shared_ptr<kratos::StmtBlock> *)stmt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  if (local_70 == (_func_int **)0x0) {
    if (then_body.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[0xc]._vptr__Sp_counted_base ==
        *(_func_int ***)
         &then_body.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[0xc]._M_use_count) {
      (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)0x0;
      *(undefined8 *)&(this->super_IRVisitor).level = 0;
    }
    else {
      std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &else_body.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)(*in_RDX + 0xc0));
      pEVar3 = Var::operator~((Var *)else_body.
                                     super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
      pIVar1 = (IfStmt *)*in_RDX;
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
                 &cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                 &(pEVar3->super_Var).super_enable_shared_from_this<kratos::Var>);
      IfStmt::set_predicate
                (pIVar1,(shared_ptr<kratos::Var> *)
                        &cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      pIVar1 = (IfStmt *)*in_RDX;
      Stmt::as<kratos::ScopedStmtBlock>
                ((Stmt *)&cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      IfStmt::set_then(pIVar1,(shared_ptr<kratos::ScopedStmtBlock> *)
                              &cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      pIVar1 = (IfStmt *)*in_RDX;
      std::make_shared<kratos::ScopedStmtBlock>();
      IfStmt::set_else(pIVar1,(shared_ptr<kratos::ScopedStmtBlock> *)
                              &cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)*in_RDX;
      lVar2 = in_RDX[1];
      in_RDX[1] = 0;
      *(long *)&(this->super_IRVisitor).level = lVar2;
      *in_RDX = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cond);
    }
  }
  else {
    pIVar1 = (IfStmt *)*in_RDX;
    Stmt::as<kratos::ScopedStmtBlock>
              ((Stmt *)&else_body.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    IfStmt::set_then(pIVar1,(shared_ptr<kratos::ScopedStmtBlock> *)
                            &else_body.
                             super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cond);
    (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)*in_RDX;
    lVar2 = in_RDX[1];
    in_RDX[1] = 0;
    *(long *)&(this->super_IRVisitor).level = lVar2;
    *in_RDX = 0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&else_body);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&then_body);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&then_);
  sVar4.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<kratos::IfStmt>)
         sVar4.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IfStmt> process(std::shared_ptr<IfStmt> stmt) {
        auto then_ = stmt->then_body();
        auto then_body = process(then_);
        auto else_body = process(stmt->else_body());
        if (!then_body) {
            // then is empty
            if (else_body->empty()) {
                return nullptr;
            } else {
                // invert the condition and make else then
                auto cond = stmt->predicate();
                auto& new_cond = ~(*cond);
                stmt->set_predicate(new_cond.shared_from_this());
                stmt->set_then(else_body->as<ScopedStmtBlock>());
                stmt->set_else(std::make_shared<ScopedStmtBlock>());
                return stmt;
            }
        }
        stmt->set_then(then_body->as<ScopedStmtBlock>());
        return stmt;
    }